

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

Matrix6x6 * __thiscall iDynTree::Transform::asAdjointTransformWrench(Transform *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  Rotation *pRVar10;
  long lVar11;
  Matrix6x6 *in_RDI;
  double adStack_58 [2];
  type tmp;
  
  pRVar10 = &this->rot;
  lVar11 = 0;
  do {
    puVar2 = (undefined8 *)((long)(this->rot).super_Matrix3x3.m_data + lVar11);
    uVar9 = puVar2[1];
    puVar1 = (undefined8 *)((long)in_RDI->m_data + lVar11 * 2);
    *puVar1 = *puVar2;
    puVar1[1] = uVar9;
    *(undefined8 *)((long)in_RDI->m_data + lVar11 * 2 + 0x10) =
         *(undefined8 *)((long)(this->rot).super_Matrix3x3.m_data + lVar11 + 0x10);
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x48);
  lVar11 = 0x28;
  do {
    *(undefined1 (*) [16])((long)in_RDI->m_data + lVar11 + -0x10) = (undefined1  [16])0x0;
    *(undefined8 *)((long)in_RDI->m_data + lVar11) = 0;
    lVar11 = lVar11 + 0x30;
  } while (lVar11 != 0xb8);
  dVar3 = (this->pos).super_Vector3.m_data[2];
  dVar7 = (this->pos).super_Vector3.m_data[0];
  dVar8 = (this->pos).super_Vector3.m_data[1];
  lVar11 = 2;
  do {
    dVar4 = (pRVar10->super_Matrix3x3).m_data[0];
    dVar5 = (pRVar10->super_Matrix3x3).m_data[3];
    dVar6 = (pRVar10->super_Matrix3x3).m_data[6];
    adStack_58[lVar11] = dVar6 * dVar8 + dVar5 * -dVar3 + dVar4 * 0.0;
    tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar11 + -1] = dVar6 * -dVar7 + dVar5 * 0.0 + dVar4 * dVar3;
    tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[lVar11]
         = (dVar6 * 0.0 + dVar5 * dVar7) - dVar4 * dVar8;
    lVar11 = lVar11 + 3;
    pRVar10 = (Rotation *)((pRVar10->super_Matrix3x3).m_data + 1);
  } while (lVar11 != 0xb);
  in_RDI->m_data[0x12] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
  in_RDI->m_data[0x13] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
  in_RDI->m_data[0x14] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
  in_RDI->m_data[0x18] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  in_RDI->m_data[0x19] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
  in_RDI->m_data[0x1a] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
  in_RDI->m_data[0x1e] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
  in_RDI->m_data[0x1f] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
  in_RDI->m_data[0x20] =
       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
  lVar11 = 0;
  do {
    puVar1 = (undefined8 *)((long)(this->rot).super_Matrix3x3.m_data + lVar11);
    uVar9 = puVar1[1];
    puVar2 = (undefined8 *)((long)in_RDI->m_data + lVar11 * 2 + 0xa8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar9;
    *(undefined8 *)((long)in_RDI->m_data + lVar11 * 2 + 0xb8) =
         *(undefined8 *)((long)(this->rot).super_Matrix3x3.m_data + lVar11 + 0x10);
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x48);
  return in_RDI;
}

Assistant:

Matrix6x6 Transform::asAdjointTransformWrench() const
    {
        Matrix6x6 ret;

        Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

        Eigen::Map<const Eigen::Vector3d> p(this->getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(this->getRotation().data());

        retEigen.block<3,3>(0,0) = R;
        retEigen.block<3,3>(0,3).setZero();
        retEigen.block<3,3>(3,0) = mySkew(p)*R;
        retEigen.block<3,3>(3,3) = R;

        return ret;
    }